

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O0

bool __thiscall
Key_Offset_Store_Data::operator==(Key_Offset_Store_Data *this,Am_Wrapper *test_value)

{
  uint uVar1;
  uint uVar2;
  bool local_31;
  Am_Wrapper *test_value_local;
  Key_Offset_Store_Data *this_local;
  
  uVar1 = (uint)id;
  uVar2 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)();
  if (uVar1 == (uVar2 & 0xffff)) {
    local_31 = true;
    if ((Key_Offset_Store_Data *)test_value != this) {
      local_31 = operator==((Key_Offset_Store_Data *)test_value,this);
    }
    this_local._7_1_ = local_31;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline void
modify_value(Am_Value &value, int offset, float multiplier)
{
  switch (value.type) {
  case Am_INT:
  case Am_LONG:
    value.value.long_value =
        (long)(value.value.long_value * multiplier) + offset;
    break;
  case Am_FLOAT:
    value.value.float_value = (value.value.float_value * multiplier) + offset;
    break;
  case Am_DOUBLE: {
    double d_value = value;
    d_value = (d_value * multiplier) + offset;
    value = d_value;
    break;
  }
  default:
    break;
  }
}